

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void charFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte *z;
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  byte *pbVar5;
  ulong uVar6;
  
  z = (byte *)sqlite3_malloc64((long)(argc * 4 + 1));
  if (z == (byte *)0x0) {
    sqlite3_result_error_nomem(context);
    return;
  }
  uVar4 = 0;
  pbVar5 = z;
  uVar6 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar6 = uVar4;
  }
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    uVar1 = sqlite3VdbeIntValue(argv[uVar4]);
    uVar3 = (uint)uVar1 & 0x1fffff;
    if (0x10ffff < uVar1) {
      uVar3 = 0xfffd;
    }
    bVar2 = (byte)uVar3;
    if (uVar3 < 0x80) {
      *pbVar5 = bVar2;
      pbVar5 = pbVar5 + 1;
    }
    else if (uVar3 < 0x800) {
      *pbVar5 = (byte)(uVar3 >> 6) | 0xc0;
      pbVar5[1] = bVar2 & 0x3f | 0x80;
      pbVar5 = pbVar5 + 2;
    }
    else if (uVar3 < 0x10000) {
      *pbVar5 = (byte)(uVar3 >> 0xc) | 0xe0;
      pbVar5[1] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
      pbVar5[2] = bVar2 & 0x3f | 0x80;
      pbVar5 = pbVar5 + 3;
    }
    else {
      *pbVar5 = (byte)(uVar3 >> 0x12) | 0xf0;
      pbVar5[1] = (byte)(uVar3 >> 0xc) & 0x3f | 0x80;
      pbVar5[2] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
      pbVar5[3] = bVar2 & 0x3f | 0x80;
      pbVar5 = pbVar5 + 4;
    }
  }
  *pbVar5 = 0;
  sqlite3_result_text64(context,(char *)z,(long)pbVar5 - (long)z,sqlite3_free,'\x01');
  return;
}

Assistant:

static void charFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  unsigned char *z, *zOut;
  int i;
  zOut = z = sqlite3_malloc64( argc*4+1 );
  if( z==0 ){
    sqlite3_result_error_nomem(context);
    return;
  }
  for(i=0; i<argc; i++){
    sqlite3_int64 x;
    unsigned c;
    x = sqlite3_value_int64(argv[i]);
    if( x<0 || x>0x10ffff ) x = 0xfffd;
    c = (unsigned)(x & 0x1fffff);
    if( c<0x00080 ){
      *zOut++ = (u8)(c&0xFF);
    }else if( c<0x00800 ){
      *zOut++ = 0xC0 + (u8)((c>>6)&0x1F);
      *zOut++ = 0x80 + (u8)(c & 0x3F);
    }else if( c<0x10000 ){
      *zOut++ = 0xE0 + (u8)((c>>12)&0x0F);
      *zOut++ = 0x80 + (u8)((c>>6) & 0x3F);
      *zOut++ = 0x80 + (u8)(c & 0x3F);
    }else{
      *zOut++ = 0xF0 + (u8)((c>>18) & 0x07);
      *zOut++ = 0x80 + (u8)((c>>12) & 0x3F);
      *zOut++ = 0x80 + (u8)((c>>6) & 0x3F);
      *zOut++ = 0x80 + (u8)(c & 0x3F);
    }                                                    \
  }
  *zOut = 0;
  sqlite3_result_text64(context, (char*)z, zOut-z, sqlite3_free, SQLITE_UTF8);
}